

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O2

USV * singular::Svd<60,_50>::decomposeUSV(USV *__return_storage_ptr__,Matrix<60,_50> *m)

{
  bool bVar1;
  bool bVar2;
  Matrix<50,_50> MVar3;
  USV *pUVar4;
  _Head_base<2UL,_singular::Matrix<50,_50>,_false> _Var5;
  int i_1;
  ulong uVar6;
  double *pdVar7;
  int in_ECX;
  long lVar8;
  void *__child_stack;
  long lVar9;
  void *in_R8;
  int i;
  int n;
  long lVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  Matrix<50,_50> v;
  Matrix<60,_60> u;
  BidiagonalMatrix m2;
  Matrix<60,_50> local_4c0;
  DiagonalMatrix<60,_50> local_4b8;
  _Head_base<0UL,_singular::Matrix<60,_60>,_false> local_4b0;
  USV *local_4a8;
  _Head_base<2UL,_singular::Matrix<50,_50>,_false> local_4a0;
  int shuffle [60];
  double ss [50];
  double ss2 [60];
  
  Matrix<60,_60>::identity();
  Matrix<50,_50>::identity();
  Matrix<60,_50>::clone(&local_4c0,(__fn *)m,__child_stack,in_ECX,in_R8);
  local_4a8 = __return_storage_ptr__;
  bidiagonalize((Svd<60,_50> *)&m2,&u,&local_4c0,&v);
  Matrix<60,_50>::release(&local_4c0);
  iVar11 = 0;
  iVar12 = 0x32;
LAB_00106539:
  n = iVar12;
  iVar12 = n + -1;
  do {
    if (n < 2) {
LAB_001065b8:
      lVar9 = 0;
      for (lVar10 = 0; pUVar4 = local_4a8, lVar10 != 0x32; lVar10 = lVar10 + 1) {
        iVar12 = (int)lVar10;
        dVar13 = BidiagonalMatrix::operator()(&m2,iVar12,iVar12);
        dVar14 = BidiagonalMatrix::operator()(&m2,iVar12,iVar12);
        if (0.0 <= dVar13) {
          ss[lVar10] = dVar14;
        }
        else {
          ss[lVar10] = -dVar14;
          for (lVar8 = 0; lVar8 != 20000; lVar8 = lVar8 + 400) {
            *(ulong *)((long)v.pBlock + lVar8 + lVar9) =
                 *(ulong *)((long)v.pBlock + lVar8 + lVar9) ^ 0x8000000000000000;
          }
        }
        lVar9 = lVar9 + 8;
      }
      bVar1 = false;
      for (uVar6 = 0; uVar6 != 0x3c; uVar6 = uVar6 + 1) {
        shuffle[uVar6] = (int)uVar6;
        bVar2 = !bVar1;
        bVar1 = true;
        if (bVar2) {
          if (uVar6 < 0x31) {
            bVar1 = ss[uVar6] <= ss[uVar6 + 1] && ss[uVar6 + 1] != ss[uVar6];
          }
          else {
            bVar1 = false;
          }
        }
      }
      if (bVar1) {
        std::
        __sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<singular::Svd<60,50>::decomposeUSV(singular::Matrix<60,50>const&)::_lambda(int,int)_1_>>
                  (shuffle,shuffle + 0x32,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kikuomax[P]singular_src_singular_Svd_h:138:37)>
                    )ss);
        for (lVar9 = 0; lVar9 != 200; lVar9 = lVar9 + 4) {
          *(double *)((long)ss2 + lVar9 * 2) = ss[*(int *)((long)shuffle + lVar9)];
        }
        Matrix<60,_60>::shuffleColumns(&local_4b0._M_head_impl,(int *)&u);
        pdVar7 = (double *)operator_new__(400);
        local_4b8.pBlock = pdVar7;
        memcpy(pdVar7,ss2,400);
        Matrix<50,_50>::shuffleColumns(&local_4a0._M_head_impl,(int *)&v);
        _Var5._M_head_impl.pBlock = local_4a0._M_head_impl.pBlock;
        local_4a0._M_head_impl.pBlock = (Matrix<50,_50>)(double *)0x0;
        local_4b8.pBlock = (double *)0x0;
        (pUVar4->
        super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
        ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
        super__Tuple_impl<2UL,_singular::Matrix<50,_50>_>.
        super__Head_base<2UL,_singular::Matrix<50,_50>,_false>._M_head_impl.pBlock =
             (double *)_Var5._M_head_impl.pBlock;
        (pUVar4->
        super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
        ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
        super__Head_base<1UL,_singular::DiagonalMatrix<60,_50>,_false>._M_head_impl.pBlock = pdVar7;
        (pUVar4->
        super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
        ).super__Head_base<0UL,_singular::Matrix<60,_60>,_false>._M_head_impl.pBlock =
             (double *)local_4b0._M_head_impl.pBlock;
        local_4b0._M_head_impl.pBlock = (Matrix<60,_60>)(double *)0x0;
        Matrix<50,_50>::release(&local_4a0._M_head_impl);
        DiagonalMatrix<60,_50>::release(&local_4b8);
        Matrix<60,_60>::release(&local_4b0._M_head_impl);
      }
      else {
        pdVar7 = (double *)operator_new__(400);
        memcpy(pdVar7,ss,400);
        MVar3 = v;
        v.pBlock = (double *)0x0;
        (pUVar4->
        super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
        ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
        super__Tuple_impl<2UL,_singular::Matrix<50,_50>_>.
        super__Head_base<2UL,_singular::Matrix<50,_50>,_false>._M_head_impl.pBlock = MVar3.pBlock;
        (pUVar4->
        super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
        ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
        super__Head_base<1UL,_singular::DiagonalMatrix<60,_50>,_false>._M_head_impl.pBlock = pdVar7;
        ss2[0] = 0.0;
        (pUVar4->
        super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
        ).super__Head_base<0UL,_singular::Matrix<60,_60>,_false>._M_head_impl.pBlock = u.pBlock;
        u.pBlock = (double *)0x0;
        DiagonalMatrix<60,_50>::release((DiagonalMatrix<60,_50> *)ss2);
      }
      BidiagonalMatrix::releaseBlock(&m2);
      Matrix<50,_50>::release(&v);
      Matrix<60,_60>::release(&u);
      return pUVar4;
    }
    dVar13 = BidiagonalMatrix::operator()(&m2,iVar12,iVar12);
    if (((dVar13 == 0.0) && (!NAN(dVar13))) ||
       (dVar14 = BidiagonalMatrix::operator()(&m2,n + -2,iVar12), ABS(dVar14 / dVar13) < 1e-15))
    goto LAB_00106539;
    if (499 < iVar11) goto LAB_001065b8;
    iVar11 = iVar11 + 1;
    doFrancis(&u,&m2,&v,n);
  } while( true );
}

Assistant:

static USV decomposeUSV(const Matrix< M, N >& m) {
			// makes sure that M >= N
			// otherwise decomposes the transposed matrix
			if (M < N) {
				// A^T = V * S^T * U^T
				typename Svd< N, M >::USV usvT =
					Svd< N, M >::decomposeUSV(m.transpose());
				return std::make_tuple(
					std::move(std::get< 2 >(usvT)),
					std::get< 1 >(usvT).transpose(),
					std::move(std::get< 0 >(usvT)));
			}
			const int MAX_ITERATIONS = N * 10;
			// allocates matrices
			Matrix< M, M > u = Matrix< M, M >::identity();
			// Matrix< M, N > s = m.clone();
			Matrix< N, N > v = Matrix< N, N >::identity();
			// bidiagonalizes a given matrix
			BidiagonalMatrix m2 = bidiagonalize(u, m.clone(), v);
			// repeats Francis iteration
			int iteration = 0;
			int n = N;
			while (n >= 2) {
				// processes the n-1 x n-1 submatrix
				// if the current n x n submatrix has converged
				double bn = m2(n - 1, n - 1);
				if (bn == 0.0 || std::abs(m2(n - 2, n - 1) / bn) < 1.0e-15) {
					--n;
				} else {
					// aborts if too many iterations
					++iteration;
					if (iteration > MAX_ITERATIONS) {
						break;
					}
					doFrancis(u, m2, v, n);
				}
			}
			// copies the diagonal elements
			// and makes all singular values positive
			double ss[N];
			for (int i = 0; i < N; ++i) {
				if (m2(i, i) < 0) {
					ss[i] = -m2(i, i);
					// inverts the sign of the right singular vector
					Vector< double > vi = v.column(i);
					std::transform(
						vi.begin(), vi.end(), vi.begin(),
						[](double x) {
							return -x;
						});
				} else {
					ss[i] = m2(i, i);
				}
			}
			// sorts singular values in descending order if necessary
			int shuffle[M];  // M >= N
			bool sortNeeded = false;
			for (int i = 0; i < M; ++i) {
				shuffle[i] = i;
				sortNeeded = sortNeeded || (i < N - 1 && ss[i] < ss[i + 1]);
			}
			if (sortNeeded) {
				// shuffles the N (<= M) singular values
				std::sort(shuffle, shuffle + N, [&ss](int i, int j) {
					return ss[i] > ss[j];  // descending order
				});
				double ss2[M];
				std::transform(shuffle, shuffle + N, ss2, [&ss](int i) {
					return ss[i];
				});
				return std::make_tuple(u.shuffleColumns(shuffle),
									   DiagonalMatrix< M, N >(ss2),
									   v.shuffleColumns(shuffle));
			} else {
				return std::make_tuple(std::move(u),
									   DiagonalMatrix< M, N >(ss),
									   std::move(v));
			}
		}